

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::UnicodeString::setTo
          (UnicodeString *this,UChar *buffer,int32_t buffLength,int32_t buffCapacity)

{
  bool bVar1;
  UChar *limit;
  UChar *p;
  int32_t buffCapacity_local;
  int32_t buffLength_local;
  UChar *buffer_local;
  UnicodeString *this_local;
  
  if (((this->fUnion).fStackFields.fLengthAndFlags & 0x10U) == 0) {
    if (buffer == (UChar *)0x0) {
      releaseArray(this);
      setToEmpty(this);
    }
    else if (((buffLength < -1) || (buffCapacity < 0)) || (buffCapacity < buffLength)) {
      setToBogus(this);
    }
    else {
      p._4_4_ = buffLength;
      if (buffLength == -1) {
        limit = buffer;
        while( true ) {
          bVar1 = false;
          if (limit != buffer + buffCapacity) {
            bVar1 = *limit != L'\0';
          }
          if (!bVar1) break;
          limit = limit + 1;
        }
        p._4_4_ = (int32_t)((long)limit - (long)buffer >> 1);
      }
      releaseArray(this);
      (this->fUnion).fStackFields.fLengthAndFlags = 0;
      setArray(this,buffer,p._4_4_,buffCapacity);
    }
  }
  return this;
}

Assistant:

UnicodeString &
UnicodeString::setTo(UChar *buffer,
                     int32_t buffLength,
                     int32_t buffCapacity) {
  if(fUnion.fFields.fLengthAndFlags & kOpenGetBuffer) {
    // do not modify a string that has an "open" getBuffer(minCapacity)
    return *this;
  }

  if(buffer == NULL) {
    // treat as an empty string, do not alias
    releaseArray();
    setToEmpty();
    return *this;
  }

  if(buffLength < -1 || buffCapacity < 0 || buffLength > buffCapacity) {
    setToBogus();
    return *this;
  } else if(buffLength == -1) {
    // buffLength = u_strlen(buff); but do not look beyond buffCapacity
    const UChar *p = buffer, *limit = buffer + buffCapacity;
    while(p != limit && *p != 0) {
      ++p;
    }
    buffLength = (int32_t)(p - buffer);
  }

  releaseArray();

  fUnion.fFields.fLengthAndFlags = kWritableAlias;
  setArray(buffer, buffLength, buffCapacity);
  return *this;
}